

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateVariableCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramResourceQueryTestTarget *queryTarget,int expandLevel,bool createTestGroup)

{
  TestContext *testCtx;
  Variable *this;
  ResourceTestCase *this_00;
  undefined1 local_58 [8];
  SharedPtr variable;
  int ndx;
  TestNode *local_38;
  TestCaseGroup *group;
  bool createTestGroup_local;
  int expandLevel_local;
  ProgramResourceQueryTestTarget *queryTarget_local;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  local_38 = &targetGroup->super_TestNode;
  if (createTestGroup) {
    local_38 = (TestNode *)operator_new(0x70);
    testCtx = gles31::Context::getTestContext(context);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_38,testCtx,"basic_type","Basic variable");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,local_38);
  }
  for (variable.m_state._0_4_ = 0; (int)variable.m_state < 0x19;
      variable.m_state._0_4_ = (int)variable.m_state + 1) {
    if (generateVariableCases::variableTypes[(int)variable.m_state].level <= expandLevel) {
      this = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable
                (this,parentStructure,
                 generateVariableCases::variableTypes[(int)variable.m_state].dataType);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)local_58,(Node *)this);
      this_00 = (ResourceTestCase *)operator_new(0xb0);
      ResourceTestCase::ResourceTestCase
                (this_00,context,(SharedPtr *)local_58,queryTarget,(char *)0x0);
      tcu::TestNode::addChild(local_38,(TestNode *)this_00);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                    *)local_58);
    }
  }
  return;
}

Assistant:

static void generateVariableCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, const ProgramResourceQueryTestTarget& queryTarget, int expandLevel = 3, bool createTestGroup = true)
{
	static const struct
	{
		int				level;
		glu::DataType	dataType;
	} variableTypes[] =
	{
		{ 0,	glu::TYPE_FLOAT			},
		{ 1,	glu::TYPE_INT			},
		{ 1,	glu::TYPE_UINT			},
		{ 1,	glu::TYPE_BOOL			},

		{ 3,	glu::TYPE_FLOAT_VEC2	},
		{ 1,	glu::TYPE_FLOAT_VEC3	},
		{ 1,	glu::TYPE_FLOAT_VEC4	},

		{ 3,	glu::TYPE_INT_VEC2		},
		{ 2,	glu::TYPE_INT_VEC3		},
		{ 3,	glu::TYPE_INT_VEC4		},

		{ 3,	glu::TYPE_UINT_VEC2		},
		{ 2,	glu::TYPE_UINT_VEC3		},
		{ 3,	glu::TYPE_UINT_VEC4		},

		{ 3,	glu::TYPE_BOOL_VEC2		},
		{ 2,	glu::TYPE_BOOL_VEC3		},
		{ 3,	glu::TYPE_BOOL_VEC4		},

		{ 2,	glu::TYPE_FLOAT_MAT2	},
		{ 3,	glu::TYPE_FLOAT_MAT2X3	},
		{ 3,	glu::TYPE_FLOAT_MAT2X4	},
		{ 2,	glu::TYPE_FLOAT_MAT3X2	},
		{ 2,	glu::TYPE_FLOAT_MAT3	},
		{ 3,	glu::TYPE_FLOAT_MAT3X4	},
		{ 2,	glu::TYPE_FLOAT_MAT4X2	},
		{ 3,	glu::TYPE_FLOAT_MAT4X3	},
		{ 2,	glu::TYPE_FLOAT_MAT4	},
	};

	tcu::TestCaseGroup* group;

	if (createTestGroup)
	{
		group = new tcu::TestCaseGroup(context.getTestContext(), "basic_type", "Basic variable");
		targetGroup->addChild(group);
	}
	else
		group = targetGroup;

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(variableTypes); ++ndx)
	{
		if (variableTypes[ndx].level <= expandLevel)
		{
			const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(parentStructure, variableTypes[ndx].dataType));
			group->addChild(new ResourceTestCase(context, variable, queryTarget));
		}
	}
}